

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureHandler.cxx
# Opt level: O0

int __thiscall cmCTestConfigureHandler::ProcessHandler(cmCTestConfigureHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  string local_14b8 [32];
  undefined1 local_1498 [8];
  ostringstream cmCTestLog_msg_7;
  string local_1320 [32];
  undefined1 local_1300 [8];
  ostringstream cmCTestLog_msg_6;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1188;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1180;
  duration<long,_std::ratio<60L,_1L>_> local_1178;
  rep local_1170;
  allocator<char> local_1161;
  string local_1160;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1140;
  allocator<char> local_1131;
  string local_1130;
  string local_1110;
  allocator<char> local_10e9;
  string local_10e8;
  allocator<char> local_10c1;
  string local_10c0;
  allocator<char> local_1099;
  string local_1098;
  string local_1078 [32];
  undefined1 local_1058 [8];
  ostringstream cmCTestLog_msg_5;
  allocator<char> local_ed9;
  string local_ed8;
  allocator<char> local_eb1;
  string local_eb0;
  allocator<char> local_e89;
  string local_e88;
  allocator<char> local_e61;
  string local_e60;
  undefined1 local_e40 [8];
  cmXMLWriter xml;
  string local_de0 [32];
  undefined1 local_dc0 [8];
  ostringstream cmCTestLog_msg_4;
  undefined1 local_c48 [8];
  cmGeneratedFileStream ofs;
  time_point start_time_time;
  string start_time;
  undefined1 local_998 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_820 [8];
  cmGeneratedFileStream os;
  undefined1 local_5b0 [3];
  bool res;
  int retVal;
  string output;
  time_point elapsed_time_start;
  undefined1 local_568 [8];
  ostringstream cmCTestLog_msg_2;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c8 [8];
  string buildDirectory;
  string local_3a0 [32];
  undefined1 local_380 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_201;
  string local_200;
  undefined1 local_1e0 [8];
  string cCommand;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestConfigureHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"Configure project");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
               ,0x1a,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)(cCommand.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_190);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"ConfigureCommand",&local_201);
  cmCTest::GetCTestConfiguration((string *)local_1e0,pcVar1,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
    poVar3 = std::operator<<((ostream *)local_380,
                             "Cannot find ConfigureCommand key in the DartConfiguration.tcl");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x20,pcVar4,false);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
    this_local._4_4_ = -1;
    buildDirectory.field_2._12_4_ = 1;
    goto LAB_00247e01;
  }
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"BuildDirectory",&local_3e9);
  cmCTest::GetCTestConfiguration((string *)local_3c8,pcVar1,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    output.field_2._8_8_ = std::chrono::_V2::steady_clock::now();
    std::__cxx11::string::string((string *)local_5b0);
    os._612_4_ = 0;
    os._611_1_ = 0;
    bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1300);
      poVar3 = std::operator<<((ostream *)local_1300,"Configure with command: ");
      poVar3 = std::operator<<(poVar3,(string *)local_1e0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x5f,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_1320);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1300);
LAB_00247c9c:
      if (((os._611_1_ & 1) == 0) || (os._612_4_ != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1498);
        poVar3 = std::operator<<((ostream *)local_1498,"Error(s) when configuring the project");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,99,pcVar4,false);
        std::__cxx11::string::~string(local_14b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1498);
        this_local._4_4_ = -1;
        buildDirectory.field_2._12_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
        buildDirectory.field_2._12_4_ = 1;
      }
    }
    else {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_820,None);
      bVar2 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartConfigure,"Configure",
                         (cmGeneratedFileStream *)local_820);
      if (bVar2) {
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)&start_time_time,(this->super_cmCTestGenericHandler).CTest);
        ofs._608_8_ = std::chrono::_V2::system_clock::now();
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_c48,None);
        cmCTestGenericHandler::StartLogFile
                  (&this->super_cmCTestGenericHandler,"Configure",(cmGeneratedFileStream *)local_c48
                  );
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_dc0);
        poVar3 = std::operator<<((ostream *)local_dc0,"Configure with command: ");
        poVar3 = std::operator<<(poVar3,(string *)local_1e0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x3f,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_de0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_dc0);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        xml._80_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        os._611_1_ = cmCTest::RunMakeCommand
                               (pcVar1,(string *)local_1e0,(string *)local_5b0,
                                (int *)&os.field_0x264,pcVar4,(cmDuration)xml._80_8_,
                                (ostream *)local_c48,Auto);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(local_c48 + (long)*(_func_int **)((long)local_c48 + -0x18)));
        if (bVar2) {
          std::ofstream::close();
        }
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(local_820 + (long)*(_func_int **)((long)local_820 + -0x18)));
        if (bVar2) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_e40,(ostream *)local_820,0);
          cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_e40,
                            (bool)((this->super_cmCTestGenericHandler).AppendXML & 1));
          cmCTest::GenerateSubprojectsOutput
                    ((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_e40);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e60,"Configure",&local_e61);
          cmXMLWriter::StartElement((cmXMLWriter *)local_e40,&local_e60);
          std::__cxx11::string::~string((string *)&local_e60);
          std::allocator<char>::~allocator(&local_e61);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e88,"StartDateTime",&local_e89);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_e40,&local_e88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &start_time_time);
          std::__cxx11::string::~string((string *)&local_e88);
          std::allocator<char>::~allocator(&local_e89);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_eb0,"StartConfigureTime",&local_eb1);
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_e40,&local_eb0,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&ofs.field_0x260);
          std::__cxx11::string::~string((string *)&local_eb0);
          std::allocator<char>::~allocator(&local_eb1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ed8,"ConfigureCommand",&local_ed9);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_e40,&local_ed8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0)
          ;
          std::__cxx11::string::~string((string *)&local_ed8);
          std::allocator<char>::~allocator(&local_ed9);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1058);
          poVar3 = std::operator<<((ostream *)local_1058,"End");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                       ,0x50,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1078);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1058);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1098,"Log",&local_1099);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_e40,&local_1098,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0)
          ;
          std::__cxx11::string::~string((string *)&local_1098);
          std::allocator<char>::~allocator(&local_1099);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_10c0,"ConfigureStatus",&local_10c1);
          cmXMLWriter::Element<int>((cmXMLWriter *)local_e40,&local_10c0,(int *)&os.field_0x264);
          std::__cxx11::string::~string((string *)&local_10c0);
          std::allocator<char>::~allocator(&local_10c1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_10e8,"EndDateTime",&local_10e9);
          cmCTest::CurrentTime_abi_cxx11_(&local_1110,(this->super_cmCTestGenericHandler).CTest);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_e40,&local_10e8,&local_1110);
          std::__cxx11::string::~string((string *)&local_1110);
          std::__cxx11::string::~string((string *)&local_10e8);
          std::allocator<char>::~allocator(&local_10e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1130,"EndConfigureTime",&local_1131);
          local_1140.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_e40,&local_1130,&local_1140);
          std::__cxx11::string::~string((string *)&local_1130);
          std::allocator<char>::~allocator(&local_1131);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1160,"ElapsedMinutes",&local_1161);
          local_1188.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
          local_1180.__r =
               (rep)std::chrono::operator-
                              (&local_1188,
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)((long)&output.field_2 + 8));
          local_1178.__r =
               (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
                              (&local_1180);
          local_1170 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_1178);
          cmXMLWriter::Element<long>((cmXMLWriter *)local_e40,&local_1160,&local_1170);
          std::__cxx11::string::~string((string *)&local_1160);
          std::allocator<char>::~allocator(&local_1161);
          cmXMLWriter::EndElement((cmXMLWriter *)local_e40);
          cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_e40);
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_e40);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_c48);
        std::__cxx11::string::~string((string *)&start_time_time);
        buildDirectory.field_2._12_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
        poVar3 = std::operator<<((ostream *)local_998,"Cannot open configure file");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x35,pcVar4,false);
        std::__cxx11::string::~string((string *)(start_time.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
        this_local._4_4_ = 1;
        buildDirectory.field_2._12_4_ = 1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_820);
      if (buildDirectory.field_2._12_4_ == 0) goto LAB_00247c9c;
    }
    std::__cxx11::string::~string((string *)local_5b0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_568);
    poVar3 = std::operator<<((ostream *)local_568,
                             "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x29,pcVar4,false);
    std::__cxx11::string::~string((string *)&elapsed_time_start);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_568);
    this_local._4_4_ = -1;
    buildDirectory.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_3c8);
LAB_00247e01:
  std::__cxx11::string::~string((string *)local_1e0);
  return this_local._4_4_;
}

Assistant:

int cmCTestConfigureHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Configure project" << std::endl, this->Quiet);
  std::string cCommand =
    this->CTest->GetCTestConfiguration("ConfigureCommand");
  if (cCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find ConfigureCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  auto elapsed_time_start = std::chrono::steady_clock::now();
  std::string output;
  int retVal = 0;
  bool res = false;
  if (!this->CTest->GetShowOnly()) {
    cmGeneratedFileStream os;
    if (!this->StartResultingXML(cmCTest::PartConfigure, "Configure", os)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open configure file" << std::endl);
      return 1;
    }
    std::string start_time = this->CTest->CurrentTime();
    auto start_time_time = std::chrono::system_clock::now();

    cmGeneratedFileStream ofs;
    this->StartLogFile("Configure", ofs);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
    res = this->CTest->RunMakeCommand(cCommand, output, &retVal,
                                      buildDirectory.c_str(),
                                      cmDuration::zero(), ofs);

    if (ofs) {
      ofs.close();
    }

    if (os) {
      cmXMLWriter xml(os);
      this->CTest->StartXML(xml, this->AppendXML);
      this->CTest->GenerateSubprojectsOutput(xml);
      xml.StartElement("Configure");
      xml.Element("StartDateTime", start_time);
      xml.Element("StartConfigureTime", start_time_time);
      xml.Element("ConfigureCommand", cCommand);
      cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
      xml.Element("Log", output);
      xml.Element("ConfigureStatus", retVal);
      xml.Element("EndDateTime", this->CTest->CurrentTime());
      xml.Element("EndConfigureTime", std::chrono::system_clock::now());
      xml.Element("ElapsedMinutes",
                  std::chrono::duration_cast<std::chrono::minutes>(
                    std::chrono::steady_clock::now() - elapsed_time_start)
                    .count());
      xml.EndElement(); // Configure
      this->CTest->EndXML(xml);
    }
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
  }
  if (!res || retVal) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when configuring the project" << std::endl);
    return -1;
  }
  return 0;
}